

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_objects.cxx
# Opt level: O3

void __thiscall xray_re::xr_custom_object::load(xr_custom_object *this,xr_reader *r)

{
  uint32_t *dest;
  uint16_t *puVar1;
  float *pfVar2;
  size_t sVar3;
  uint16_t *puVar4;
  xr_obj_motion *this_00;
  uint16_t local_1a;
  
  dest = &this->m_flags;
  sVar3 = xr_reader::r_raw_chunk(r,0xf906,dest,4);
  if (sVar3 == 0) {
    sVar3 = xr_reader::find_chunk(r,0xf900);
    if (sVar3 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_objects.cxx"
                    ,0x2d,"virtual void xray_re::xr_custom_object::load(xr_reader &)");
    }
    *dest = 0;
    puVar1 = (r->field_2).m_p_u16;
    puVar4 = puVar1 + 1;
    (r->field_2).m_p_u16 = puVar4;
    if (*puVar1 != 0) {
      *(byte *)dest = (byte)*dest | 1;
      puVar4 = (r->field_2).m_p_u16;
    }
    (r->field_2).m_p = (uint8_t *)(puVar4 + 1);
    local_1a = *puVar4;
    if (local_1a != 0) {
      *(byte *)dest = (byte)*dest | 2;
    }
    xr_reader::r_sz(r,&this->m_name);
    sVar3 = xr_reader::r_raw_chunk(r,0xf902,&local_1a,2);
    if ((sVar3 != 0) && (local_1a != 0)) {
      *(byte *)dest = (byte)*dest | 4;
    }
  }
  else {
    sVar3 = xr_reader::find_chunk(r,0xf907);
    if (sVar3 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_objects.cxx"
                    ,0x1c,"virtual void xray_re::xr_custom_object::load(xr_reader &)");
    }
    xr_reader::r_sz(r,&this->m_name);
  }
  sVar3 = xr_reader::find_chunk(r,0xf903);
  if (sVar3 != 0) {
    pfVar2 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
    (this->m_position).field_0.field_0.x = *pfVar2;
    pfVar2 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
    (this->m_position).field_0.field_0.y = *pfVar2;
    pfVar2 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
    (this->m_position).field_0.field_0.z = *pfVar2;
    pfVar2 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
    (this->m_rotation).field_0.field_0.x = *pfVar2;
    pfVar2 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
    (this->m_rotation).field_0.field_0.y = *pfVar2;
    pfVar2 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
    (this->m_rotation).field_0.field_0.z = *pfVar2;
    pfVar2 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
    (this->m_scale).field_0.field_0.x = *pfVar2;
    pfVar2 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
    (this->m_scale).field_0.field_0.y = *pfVar2;
    pfVar2 = (float *)(r->field_2).m_p_u32;
    (r->field_2).m_p = (uint8_t *)(pfVar2 + 1);
    (this->m_scale).field_0.field_0.z = *pfVar2;
  }
  sVar3 = xr_reader::find_chunk(r,0xf905);
  if (sVar3 != 0) {
    this_00 = (xr_obj_motion *)operator_new(0x70);
    xr_obj_motion::xr_obj_motion(this_00);
    this->m_motion = this_00;
    (*(this_00->super_xr_motion)._vptr_xr_motion[2])(this_00,r);
  }
  sVar3 = xr_reader::r_raw_chunk(r,0xf908,&this->m_time,4);
  if ((sVar3 != 0) && (this->m_motion == (xr_obj_motion *)0x0)) {
    __assert_fail("m_motion",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_objects.cxx"
                  ,0x3b,"virtual void xray_re::xr_custom_object::load(xr_reader &)");
  }
  return;
}

Assistant:

void xr_custom_object::load(xr_reader& r)
{
	if (r.r_chunk(CUSTOMOBJECT_CHUNK_FLAGS, m_flags)) {
		if (!r.find_chunk(CUSTOMOBJECT_CHUNK_NAME))
			xr_not_expected();
		r.r_sz(m_name);
		r.debug_find_chunk();
	} else if (r.find_chunk(CUSTOMOBJECT_CHUNK_PARAMS)) {
		m_flags = 0;
		uint16_t flag = r.r_u16();
		if (flag)
			m_flags |= COF_SELECTED;
		flag = r.r_u16();
		if (flag)
			m_flags |= COF_VISIBLE;
		r.r_sz(m_name);
		r.debug_find_chunk();

		if (r.r_chunk(CUSTOMOBJECT_CHUNK_f902, flag) && flag)
			m_flags |= COF_LOCKED;
	} else {
		xr_not_expected();
	}
	if (r.find_chunk(CUSTOMOBJECT_CHUNK_XFORM)) {
		r.r_fvector3(m_position);
		r.r_fvector3(m_rotation);
		r.r_fvector3(m_scale);
		r.debug_find_chunk();
	}
	if (r.find_chunk(CUSTOMOBJECT_CHUNK_MOTION)) {
		m_motion = new xr_obj_motion();
		m_motion->load(r);
		r.debug_find_chunk();
	}
	if (r.r_chunk(CUSTOMOBJECT_CHUNK_TIME, m_time)) {
		xr_assert(m_motion);
	}
}